

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.c
# Opt level: O1

char ** apprun_read_lines(FILE *fp)

{
  uint size;
  int i;
  char **__lineptr;
  long lVar1;
  char **ppcVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  size_t len;
  size_t local_38;
  
  __lineptr = apprun_string_list_alloc(0x400);
  if (fp != (FILE *)0x0) {
    local_38 = 0;
    lVar1 = getline(__lineptr,&local_38,(FILE *)fp);
    if (lVar1 != -1) {
      uVar4 = 0x400;
      lVar3 = 1;
      uVar5 = 0;
      ppcVar2 = __lineptr;
      do {
        if ((0 < lVar1) && ((*ppcVar2)[lVar1 + -1] == '\n')) {
          (*ppcVar2)[lVar1 + -1] = '\0';
        }
        uVar5 = uVar5 + 1;
        if (uVar5 == uVar4) {
          size = (int)uVar4 * 2;
          uVar4 = (ulong)size;
          ppcVar2 = apprun_string_list_alloc(size);
          lVar1 = 0;
          do {
            ppcVar2[lVar1] = __lineptr[lVar1];
            lVar1 = lVar1 + 1;
          } while (lVar3 != lVar1);
          free(__lineptr);
          __lineptr = ppcVar2;
        }
        ppcVar2 = __lineptr + uVar5;
        lVar1 = getline(ppcVar2,&local_38,(FILE *)fp);
        lVar3 = lVar3 + 1;
      } while (lVar1 != -1);
      goto LAB_00106211;
    }
  }
  uVar5 = 0;
LAB_00106211:
  __lineptr[uVar5] = (char *)0x0;
  return __lineptr;
}

Assistant:

char **apprun_read_lines(FILE *fp) {
    int array_len = 1024;
    int count = 0;
    char **result = apprun_string_list_alloc(array_len);

    if (fp) {
        size_t len = 0;
        ssize_t read;

        while ((read = getline(&result[count], &len, fp)) != -1) {
            if (read > 0 && result[count][read - 1] == '\n')
                result[count][read - 1] = 0;
            count++;
            if (count == array_len) {
                array_len = array_len * 2;
                char **old_array = result;

                result = apprun_string_list_alloc(array_len);
                for (int i = 0; i < count; i++)
                    result[i] = old_array[i];

                free(old_array);
            }
        }
    }

    result[count] = NULL;

    return result;
}